

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::ReadWriteMemTask::checkArguments
          (ReadWriteMemTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Scope *pSVar1;
  Compilation *pCVar2;
  bool bVar3;
  bool bVar4;
  Type *this_00;
  Diagnostic *this_01;
  Type *pTVar5;
  ulong uVar6;
  char *func;
  Expression *arg;
  Type *unaff_RBP;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
    goto LAB_00382a10;
  }
  pCVar2 = pSVar1->compilation;
  bVar3 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,2,4);
  if (!bVar3) {
LAB_00382973:
    return pCVar2->errorType;
  }
  if ((this->super_SystemTaskBase).super_SystemSubroutine.field_0x34 == '\x01') {
    if (args->size_ < 2) goto LAB_003829df;
    bVar3 = Expression::requireLValue
                      (args->data_[1],context,(SourceLocation)0x0,
                       (bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0,(EvalContext *)0x0);
    if (!bVar3) goto LAB_00382973;
  }
  if (args->size_ == 0) goto LAB_003829df;
  pTVar5 = ((*args->data_)->type).ptr;
  if (pTVar5 != (Type *)0x0) {
    bVar3 = Type::canBeStringLike(pTVar5);
    if (!bVar3) {
      if (args->size_ != 0) {
        arg = *args->data_;
        goto LAB_003829a7;
      }
      goto LAB_003829df;
    }
    if (args->size_ < 2) goto LAB_003829df;
    pTVar5 = (args->data_[1]->type).ptr;
    if (pTVar5 != (Type *)0x0) {
      bVar3 = Type::isUnpackedArray(pTVar5);
      uVar6 = args->size_;
      if (!bVar3) {
LAB_0038299a:
        if (1 < uVar6) {
          arg = args->data_[1];
LAB_003829a7:
          pTVar5 = SystemSubroutine::badArg((SystemSubroutine *)this,context,arg);
          return pTVar5;
        }
LAB_003829df:
        std::terminate();
      }
      if (uVar6 < 2) goto LAB_003829df;
      pTVar5 = (args->data_[1]->type).ptr;
      if (pTVar5 != (Type *)0x0) {
        do {
          if (pTVar5->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar5);
          }
          if ((pTVar5->canonical->super_Symbol).kind == AssociativeArrayType) {
            this_00 = Type::getAssociativeIndexType(pTVar5);
            bVar3 = true;
            if ((this_00 != (Type *)0x0) && (bVar4 = Type::isIntegral(this_00), !bVar4)) {
              if (args->size_ < 2) goto LAB_003829df;
              this_01 = ASTContext::addDiag(context,(DiagCode)0x1d000b,args->data_[1]->sourceRange);
              Diagnostic::operator<<
                        (this_01,&(this->super_SystemTaskBase).super_SystemSubroutine.name);
              unaff_RBP = pCVar2->errorType;
              bVar3 = false;
            }
            if (!bVar3) {
              return unaff_RBP;
            }
          }
          pTVar5 = Type::getArrayElementType(pTVar5);
          bVar3 = Type::isUnpackedArray(pTVar5);
        } while (bVar3);
        bVar3 = Type::isIntegral(pTVar5);
        uVar6 = args->size_;
        if (!bVar3) goto LAB_0038299a;
        if (uVar6 < 3) goto LAB_00382969;
        pTVar5 = (args->data_[2]->type).ptr;
        if (pTVar5 != (Type *)0x0) {
          bVar3 = Type::isNumeric(pTVar5);
          if (!bVar3) {
            if (args->size_ < 3) goto LAB_003829df;
            arg = args->data_[2];
            goto LAB_003829a7;
          }
          if (args->size_ != 4) {
LAB_00382969:
            return pCVar2->voidType;
          }
          pTVar5 = (args->data_[3]->type).ptr;
          if (pTVar5 != (Type *)0x0) {
            bVar3 = Type::isNumeric(pTVar5);
            if (!bVar3) {
              if (3 < args->size_) {
                arg = args->data_[3];
                goto LAB_003829a7;
              }
              goto LAB_003829df;
            }
            goto LAB_00382969;
          }
        }
      }
    }
  }
  func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
LAB_00382a10:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

SimpleSystemTask(const std::string& name, const Type& returnType, size_t requiredArgs = 0,
                     const std::vector<const Type*>& argTypes = {}) :
        SimpleSystemSubroutine(name, SubroutineKind::Task, requiredArgs, argTypes, returnType,
                               false) {}